

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sarimaxtest3.c
# Opt level: O3

int main(void)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  double *xpred;
  double *amse;
  FILE *__stream;
  double *inp;
  double *xreg;
  double *newxreg;
  sarimax_object obj;
  ulong uVar6;
  undefined1 *puVar7;
  long lVar8;
  int iVar9;
  undefined4 uVar10;
  undefined1 local_70d8 [8];
  double temp [1200];
  double temp1 [1200];
  double temp2 [1200];
  
  xpred = (double *)malloc(0x28);
  amse = (double *)malloc(0x28);
  __stream = fopen("../data/e1m.dat","r");
  if (__stream != (FILE *)0x0) {
    iVar5 = feof(__stream);
    iVar9 = 0;
    if (iVar5 == 0) {
      puVar7 = local_70d8;
      iVar9 = 0;
      do {
        __isoc99_fscanf(__stream,"%lf %lf %lf \n",puVar7);
        iVar5 = feof(__stream);
        puVar7 = puVar7 + 8;
        iVar9 = iVar9 + 1;
      } while (iVar5 == 0);
    }
    lVar8 = (long)iVar9;
    uVar1 = lVar8 - 5;
    inp = (double *)malloc(lVar8 * 8 - 0x28);
    xreg = (double *)malloc(uVar1 * 0x10);
    newxreg = (double *)malloc(0x50);
    if (5 < iVar9) {
      memcpy(inp,local_70d8,(uVar1 & 0xffffffff) * 8);
      uVar6 = 0;
      do {
        xreg[uVar6] = temp[uVar6 + 0x4af];
        xreg[uVar1 + uVar6] = temp1[uVar6 + 0x4af];
        uVar6 = uVar6 + 1;
      } while ((uVar1 & 0xffffffff) != uVar6);
    }
    newxreg[4] = temp[lVar8 + 0x4ae];
    dVar2 = temp[lVar8 + 0x4aa];
    dVar3 = temp[lVar8 + 0x4ab];
    dVar4 = temp[lVar8 + 0x4ad];
    newxreg[2] = temp[lVar8 + 0x4ac];
    newxreg[3] = dVar4;
    *newxreg = dVar2;
    newxreg[1] = dVar3;
    dVar2 = temp1[lVar8 + 0x4ab];
    dVar3 = temp1[lVar8 + 0x4ac];
    dVar4 = temp1[lVar8 + 0x4ad];
    newxreg[5] = temp1[lVar8 + 0x4aa];
    newxreg[6] = dVar2;
    newxreg[7] = dVar3;
    newxreg[8] = dVar4;
    newxreg[9] = temp1[lVar8 + 0x4ae];
    lVar8 = 0;
    obj = sarimax_init(2,0,2,0,0,0,0,2,1,(int)uVar1);
    sarimax_setMethod(obj,2);
    sarimax_exec(obj,inp,xreg);
    sarimax_summary(obj);
    sarimax_predict(obj,inp,xreg,5,newxreg,xpred,amse);
    putchar(10);
    printf("Predicted Values : ");
    do {
      printf("%g ",SUB84(xpred[lVar8],0));
      lVar8 = lVar8 + 1;
    } while (lVar8 != 5);
    putchar(10);
    lVar8 = 0;
    printf("Standard Errors  : ");
    do {
      dVar2 = amse[lVar8];
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
        uVar10 = SUB84(dVar2,0);
      }
      else {
        uVar10 = SUB84(SQRT(dVar2),0);
      }
      printf("%g ",uVar10);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 5);
    putchar(10);
    sarimax_free(obj);
    free(inp);
    free(xpred);
    free(amse);
    free(xreg);
    free(newxreg);
    return 0;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

int main(void) {
	int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	double *xpred, *amse,*xreg,*newxreg;
	sarimax_object obj;
	int imean = 1;
    /*
    Make sure all the parameter values are correct and consistent with other values. eg., if xreg is NULL r should be 0
    or if P = D = Q = 0 then make sure that s is also 0. 
     Recheck the values if the program fails to execute.
    */
	p = 2;
	d = 0;
	q = 2;
	s = 0;
	P = 0;
	D = 0;
	Q = 0;
	r = 2;


	L = 5;

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
    double temp1[1200];
    double temp2[1200];

	ifp = fopen("../data/e1m.dat", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf %lf %lf \n", &temp[i],&temp1[i],&temp2[i]);
		i++;
	}
	N = i - L;

	inp = (double*)malloc(sizeof(double)* N);
    xreg = (double*)malloc(sizeof(double)* N * 2);
    newxreg = (double*)malloc(sizeof(double)* L * 2);

    /*
    
    */

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
        xreg[i] = temp1[i];
		xreg[N+i] = temp2[i];
	}

    for(i = 0; i < L;++i) {
        newxreg[i] = temp1[N + i];
        newxreg[i+L] = temp2[N + i];
    }

	obj = sarimax_init(p, d, q, P, D, Q, s, r ,imean, N);

    /* setMethod()
    Method 0 ("CSS-MLE") is default. The method also accepts values 1 ("MLE") and 2 ("CSS")
    */

	sarimax_setMethod(obj, 2); 

    /*sarimax_exec(object, input time series, exogenous time series)
        set exogenous to NULL if deadling only with a univariate time series.
    */
	sarimax_exec(obj, inp,xreg);
	sarimax_summary(obj);
	/* sarimax_predict(sarimax_object obj, double *inp, double *xreg, int L,double *newxreg, double *xpred, double *amse)
        inp - Input Time Series
        xreg - Exogenous Time Series
        L - L point prediction
        newxreg - Exogenous Time Series of dimension r * L where r is the number of exogenus time series and L is the length of each
        xpred - L future values
        amse - MSE for L future values
    */
	sarimax_predict(obj, inp, xreg, L, newxreg, xpred, amse);
	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");

	sarimax_free(obj);
	free(inp);
	free(xpred);
	free(amse);
    free(xreg);
    free(newxreg);
	return 0;

}